

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::FindInitFaceConfiguration
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this,
          FaceIndex face_id,CornerIndex *out_corner)

{
  CornerTable *pCVar1;
  uint uVar2;
  CornerIndex CVar3;
  CornerIndex corner;
  CornerIndex CVar4;
  int i;
  uint uVar5;
  
  CVar4.value_ = face_id.value_ * 3;
  pCVar1 = (this->corner_table_)._M_t.
           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>._M_t.
           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
           super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
  uVar5 = 0;
  while (((uVar5 != 3 && (CVar4.value_ != 0xffffffff)) &&
         (*(int *)(*(long *)&(pCVar1->opposite_corners_).vector_.
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  + (ulong)CVar4.value_ * 4) != -1))) {
    CVar3.value_ = CVar4.value_;
    if ((this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start
        [*(uint *)(*(long *)&(pCVar1->corner_to_vertex_map_).vector_ + (ulong)CVar4.value_ * 4)] !=
        -1) goto LAB_0013303d;
    uVar2 = CVar4.value_ + 1;
    if ((CVar4.value_ + 1) % 3 == 0) {
      uVar2 = CVar4.value_ - 2;
    }
    CVar4.value_ = uVar2;
    uVar5 = uVar5 + 1;
  }
LAB_00133067:
  out_corner->value_ = (uint)CVar4;
  return 2 < uVar5;
LAB_0013303d:
  while (corner.value_ = CVar3.value_, corner.value_ != 0xffffffff) {
    CVar3 = CornerTable::SwingRight
                      ((this->corner_table_)._M_t.
                       super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                       .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl,corner);
    CVar4.value_ = corner.value_;
  }
  CVar4.value_ = (-(uint)(CVar4.value_ % 3 != 0) | 2) + CVar4.value_;
  goto LAB_00133067;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::FindInitFaceConfiguration(
    FaceIndex face_id, CornerIndex *out_corner) const {
  CornerIndex corner_index = CornerIndex(3 * face_id.value());
  for (int i = 0; i < 3; ++i) {
    if (corner_table_->Opposite(corner_index) == kInvalidCornerIndex) {
      // If there is a boundary edge, the configuration is exterior and return
      // the CornerIndex opposite to the first boundary edge.
      *out_corner = corner_index;
      return false;
    }
    if (vertex_hole_id_[corner_table_->Vertex(corner_index).value()] != -1) {
      // Boundary vertex found. Find the first boundary edge attached to the
      // point and return the corner opposite to it.
      CornerIndex right_corner = corner_index;
      while (right_corner != kInvalidCornerIndex) {
        corner_index = right_corner;
        right_corner = corner_table_->SwingRight(right_corner);
      }
      // |corner_index| now lies on a boundary edge and its previous corner is
      // guaranteed to be the opposite corner of the boundary edge.
      *out_corner = corner_table_->Previous(corner_index);
      return false;
    }
    corner_index = corner_table_->Next(corner_index);
  }
  // Else we have an interior configuration. Return the first corner id.
  *out_corner = corner_index;
  return true;
}